

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O0

void __thiscall notch::core::EuclideanLoss::EuclideanLoss(EuclideanLoss *this,size_t n)

{
  float local_1c;
  size_t local_18;
  size_t n_local;
  EuclideanLoss *this_local;
  
  local_18 = n;
  n_local = (size_t)this;
  ALossLayer::ALossLayer(&this->super_ALossLayer);
  (this->super_ALossLayer)._vptr_ALossLayer = (_func_int **)&PTR_tag_abi_cxx11__002ba948;
  this->nSize = local_18;
  local_1c = 0.0;
  std::valarray<float>::valarray(&this->lossGrad,&local_1c,local_18);
  return;
}

Assistant:

EuclideanLoss(size_t n) : nSize(n), lossGrad(0.0, n) {}